

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void Service_Call_single(UA_Server *server,UA_Session *session,UA_CallMethodRequest *request,
                        UA_CallMethodResult *result)

{
  UA_NodeClass UVar1;
  UA_NodeStore *ns;
  UA_NodeStoreEntry *pUVar2;
  UA_NodeStoreEntry *pUVar3;
  size_t __nmemb;
  undefined8 uVar4;
  UA_Boolean UVar5;
  UA_StatusCode UVar6;
  UA_NodeStoreEntry **ppUVar7;
  UA_VariableNode *pUVar8;
  UA_Variant *pUVar9;
  size_t sVar10;
  UA_NodeId *n1;
  UA_String withBrowseName;
  UA_String withBrowseName_00;
  undefined1 local_88 [8];
  UA_NodeId hasComponentNodeId;
  UA_NodeId hasSubTypeNodeId;
  
  ns = server->nodestore;
  ppUVar7 = findNode(ns,&request->methodId);
  if (ppUVar7 == (UA_NodeStoreEntry **)0x0) {
    result->statusCode = 0x80750000;
    return;
  }
  pUVar2 = *ppUVar7;
  if ((pUVar2->node).nodeClass == UA_NODECLASS_METHOD) {
    if (((*(char *)&pUVar2[1].orig != '\x01') || (*(char *)((long)&pUVar2[1].orig + 1) != '\x01'))
       || (pUVar2[1].node.nodeId.identifier.string.length == 0)) {
      result->statusCode = 0x803b0000;
      return;
    }
    ppUVar7 = findNode(ns,&request->objectId);
    if (ppUVar7 == (UA_NodeStoreEntry **)0x0) {
      result->statusCode = 0x80330000;
      return;
    }
    pUVar3 = *ppUVar7;
    UVar1 = (pUVar3->node).nodeClass;
    if ((UVar1 == UA_NODECLASS_OBJECT) || (UVar1 == UA_NODECLASS_OBJECTTYPE)) {
      local_88._0_2_ = 0;
      stack0xffffffffffffff7c = 0x2f00000000;
      hasComponentNodeId.identifier._8_2_ = 0;
      stack0xffffffffffffff94 = 0x2d00000000;
      sVar10 = (pUVar2->node).referencesSize;
      if (sVar10 != 0) {
        n1 = &(((pUVar2->node).references)->targetId).nodeId;
        do {
          if (((n1[-1].identifier.guid.data4[0] == '\x01') &&
              (UVar5 = UA_NodeId_equal(n1,&(pUVar3->node).nodeId), UVar5)) &&
             (UVar5 = isNodeInTree(ns,(UA_NodeId *)((long)&n1[-2].identifier + 8),
                                   (UA_NodeId *)local_88,
                                   (UA_NodeId *)((long)&hasComponentNodeId.identifier + 8),1), UVar5
             )) {
            withBrowseName.data = (UA_Byte *)"InputArguments";
            withBrowseName.length = 0xe;
            pUVar8 = getArgumentsVariableNode(server,(UA_MethodNode *)&pUVar2->node,withBrowseName);
            if (pUVar8 == (UA_VariableNode *)0x0) {
              if (request->inputArgumentsSize != 0) {
                result->statusCode = 0x80ab0000;
                return;
              }
            }
            else {
              UVar6 = argumentsConformsToDefinition
                                (server,pUVar8,request->inputArgumentsSize,request->inputArguments);
              result->statusCode = UVar6;
              if (UVar6 != 0) {
                return;
              }
            }
            result->outputArgumentsSize = 0;
            withBrowseName_00.data = (UA_Byte *)"OutputArguments";
            withBrowseName_00.length = 0xf;
            pUVar8 = getArgumentsVariableNode
                               (server,(UA_MethodNode *)&pUVar2->node,withBrowseName_00);
            if (pUVar8 == (UA_VariableNode *)0x0) {
              pUVar9 = result->outputArguments;
              sVar10 = 0;
            }
            else {
              __nmemb = *(size_t *)((long)&pUVar8->value + 0x18);
              if (__nmemb == 0) {
                result->outputArguments = (UA_Variant *)0x1;
                pUVar9 = (UA_Variant *)0x1;
              }
              else {
                pUVar9 = (UA_Variant *)calloc(__nmemb,0x30);
                result->outputArguments = pUVar9;
                if (pUVar9 == (UA_Variant *)0x0) {
                  result->statusCode = 0x80030000;
                  return;
                }
              }
              sVar10 = *(size_t *)((long)&pUVar8->value + 0x18);
              result->outputArgumentsSize = sVar10;
            }
            uVar4._0_2_ = pUVar2[1].node.nodeId.namespaceIndex;
            uVar4._2_2_ = *(undefined2 *)&pUVar2[1].node.nodeId.field_0x2;
            uVar4._4_4_ = pUVar2[1].node.nodeId.identifierType;
            methodCallSession = session;
            UVar6 = (*(code *)pUVar2[1].node.nodeId.identifier.string.length)
                              (uVar4,request->inputArgumentsSize,request->inputArguments,sVar10,
                               pUVar9,pUVar2,*(undefined4 *)&(pUVar3->node).nodeId,
                               (pUVar3->node).nodeId.identifier.numeric,
                               (pUVar3->node).nodeId.identifier.string.data);
            result->statusCode = UVar6;
            methodCallSession = (UA_Session *)0x0;
            return;
          }
          n1 = (UA_NodeId *)&n1[3].identifier;
          sVar10 = sVar10 - 1;
        } while (sVar10 != 0);
      }
      result->statusCode = 0x80750000;
      return;
    }
  }
  result->statusCode = 0x805f0000;
  return;
}

Assistant:

void
Service_Call_single(UA_Server *server, UA_Session *session,
                    const UA_CallMethodRequest *request,
                    UA_CallMethodResult *result) {
    /* Get/verify the method node */
    const UA_MethodNode *methodCalled =
        (const UA_MethodNode*)UA_NodeStore_get(server->nodestore, &request->methodId);
    if(!methodCalled) {
        result->statusCode = UA_STATUSCODE_BADMETHODINVALID;
        return;
    }
    if(methodCalled->nodeClass != UA_NODECLASS_METHOD) {
        result->statusCode = UA_STATUSCODE_BADNODECLASSINVALID;
        return;
    }
    if(!methodCalled->executable || !methodCalled->userExecutable || !methodCalled->attachedMethod) {
        result->statusCode = UA_STATUSCODE_BADNOTWRITABLE; // There is no NOTEXECUTABLE?
        return;
    }

    /* Get/verify the object node */
    const UA_ObjectNode *withObject =
        (const UA_ObjectNode*)UA_NodeStore_get(server->nodestore, &request->objectId);
    if(!withObject) {
        result->statusCode = UA_STATUSCODE_BADNODEIDINVALID;
        return;
    }
    if(withObject->nodeClass != UA_NODECLASS_OBJECT && withObject->nodeClass != UA_NODECLASS_OBJECTTYPE) {
        result->statusCode = UA_STATUSCODE_BADNODECLASSINVALID;
        return;
    }

    /* Verify method/object relations. Object must have a hasComponent or a
     * subtype of hasComponent reference to the method node. Therefore, check
     * every reference between the parent object and the method node if there is
     * a hasComponent (or subtype) reference */
    UA_Boolean found = false;
    UA_NodeId hasComponentNodeId = UA_NODEID_NUMERIC(0,UA_NS0ID_HASCOMPONENT);
    UA_NodeId hasSubTypeNodeId = UA_NODEID_NUMERIC(0,UA_NS0ID_HASSUBTYPE);
    for(size_t i = 0; i < methodCalled->referencesSize; ++i) {
        if(methodCalled->references[i].isInverse &&
           UA_NodeId_equal(&methodCalled->references[i].targetId.nodeId, &withObject->nodeId)) {
            found = isNodeInTree(server->nodestore, &methodCalled->references[i].referenceTypeId,
                                 &hasComponentNodeId, &hasSubTypeNodeId, 1);
            if(found)
                break;
        }
    }
    if(!found) {
        result->statusCode = UA_STATUSCODE_BADMETHODINVALID;
        return;
    }

    /* Verify Input Argument count, types and sizes */
    const UA_VariableNode *inputArguments =
        getArgumentsVariableNode(server, methodCalled, UA_STRING("InputArguments"));

    if(!inputArguments) {
        if(request->inputArgumentsSize > 0) {
            result->statusCode = UA_STATUSCODE_BADINVALIDARGUMENT;
            return;
        }
    } else {
        result->statusCode = argumentsConformsToDefinition(server, inputArguments,
                                                           request->inputArgumentsSize,
                                                           request->inputArguments);
        if(result->statusCode != UA_STATUSCODE_GOOD)
            return;
    }

    /* Allocate the output arguments */
    result->outputArgumentsSize = 0; /* the default */
    const UA_VariableNode *outputArguments =
        getArgumentsVariableNode(server, methodCalled, UA_STRING("OutputArguments"));
    if(outputArguments) {
        result->outputArguments = UA_Array_new(outputArguments->value.data.value.value.arrayLength,
                                               &UA_TYPES[UA_TYPES_VARIANT]);
        if(!result->outputArguments) {
            result->statusCode = UA_STATUSCODE_BADOUTOFMEMORY;
            return;
        }
        result->outputArgumentsSize = outputArguments->value.data.value.value.arrayLength;
    }

    /* Call the method */
#if defined(UA_ENABLE_METHODCALLS) && defined(UA_ENABLE_SUBSCRIPTIONS)
    methodCallSession = session;
#endif
    result->statusCode = methodCalled->attachedMethod(methodCalled->methodHandle, withObject->nodeId,
                                                      request->inputArgumentsSize, request->inputArguments,
                                                      result->outputArgumentsSize, result->outputArguments);
#if defined(UA_ENABLE_METHODCALLS) && defined(UA_ENABLE_SUBSCRIPTIONS)
    methodCallSession = NULL;
#endif

    /* TODO: Verify Output matches the argument definition */
}